

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BlancedBinaryTree.c
# Opt level: O1

int SearchBBT(BiTree T,int key,BiTree m,BiTree *p)

{
  while( true ) {
    if (T == (BiTree)0x0) {
      *p = m;
      return 0;
    }
    if (T->data == key) break;
    m = T;
    if (key < T->data) {
      T = T->lchild;
    }
    else {
      T = T->rchlid;
    }
  }
  *p = T;
  return 1;
}

Assistant:

int SearchBBT(BiTree T,int key,BiTree m,BiTree *p){
    if(!T){             //查找失败
        *p = m;
        return 0;
    }
    else if (key == T->data){   //找到key
        *p = T;
        return 1;
    }
    else if(key < T->data){
        return SearchBBT(T->lchild,key,T,p);
    }
    else {
        return SearchBBT(T->rchlid,key,T,p);
    }
}